

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

bool __thiscall google::protobuf::Descriptor::IsExtensionNumber(Descriptor *this,int number)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar1 = *(uint *)(this + 0x58);
  uVar2 = 0;
  uVar3 = 0;
  if (0 < (int)uVar1) {
    uVar3 = (ulong)uVar1;
  }
  for (; (uVar3 != uVar2 &&
         ((number < *(int *)(*(long *)(this + 0x60) + uVar2 * 8) ||
          (*(int *)(*(long *)(this + 0x60) + 4 + uVar2 * 8) <= number)))); uVar2 = uVar2 + 1) {
  }
  return (long)uVar2 < (long)(int)uVar1;
}

Assistant:

bool Descriptor::IsExtensionNumber(int number) const {
  // Linear search should be fine because we don't expect a message to have
  // more than a couple extension ranges.
  for (int i = 0; i < extension_range_count(); i++) {
    if (number >= extension_range(i)->start &&
        number <  extension_range(i)->end) {
      return true;
    }
  }
  return false;
}